

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::suppresssteinerpoints(tetgenmesh *this)

{
  uint uVar1;
  int iVar2;
  tetgenbehavior *ptVar3;
  point searchpt;
  long lVar4;
  char **ppcVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  arraypool *paVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  tetgenmesh *this_00;
  long lVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double local_a8;
  optparameters local_68;
  
  if (this->b->quiet == 0) {
    puts("Suppressing Steiner points ...");
  }
  iVar15 = this->b->fliplinklevel;
  this->b->fliplinklevel = 100000;
  paVar11 = this->subvertstack;
  if (paVar11->objects < 1) {
    iVar14 = 0;
  }
  else {
    lVar13 = 0;
    iVar14 = 0;
    do {
      if ((*(uint *)((long)*(point *)(paVar11->toparray
                                      [(uint)lVar13 >> ((byte)paVar11->log2objectsperblock & 0x1f)]
                                     + (long)paVar11->objectbytes *
                                       (long)(int)(paVar11->objectsperblockmark & (uint)lVar13)) +
                    (long)this->pointmarkindex * 4 + 4) & 0xfffffe00) == 0x600) {
        iVar9 = suppressbdrysteinerpoint
                          (this,*(point *)(paVar11->toparray
                                           [(uint)lVar13 >>
                                            ((byte)paVar11->log2objectsperblock & 0x1f)] +
                                          (long)paVar11->objectbytes *
                                          (long)(int)(paVar11->objectsperblockmark & (uint)lVar13)))
        ;
        iVar14 = iVar14 + iVar9;
      }
      lVar13 = lVar13 + 1;
      paVar11 = this->subvertstack;
    } while (lVar13 < paVar11->objects);
  }
  if ((0 < iVar14) && (this->b->verbose != 0)) {
    printf("  Suppressed %d boundary Steiner points.\n");
  }
  iVar14 = 0;
  if ((0 < this->b->supsteiner_level) && (paVar11 = this->subvertstack, 0 < paVar11->objects)) {
    lVar13 = 0;
    iVar14 = 0;
    do {
      if ((*(uint *)((long)*(point *)(paVar11->toparray
                                      [(uint)lVar13 >> ((byte)paVar11->log2objectsperblock & 0x1f)]
                                     + (long)paVar11->objectbytes *
                                       (long)(int)(paVar11->objectsperblockmark & (uint)lVar13)) +
                    (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x800) {
        iVar9 = removevertexbyflips(this,*(point *)(paVar11->toparray
                                                    [(uint)lVar13 >>
                                                     ((byte)paVar11->log2objectsperblock & 0x1f)] +
                                                   (long)paVar11->objectbytes *
                                                   (long)(int)(paVar11->objectsperblockmark &
                                                              (uint)lVar13)));
        iVar14 = iVar14 + iVar9;
      }
      lVar13 = lVar13 + 1;
      paVar11 = this->subvertstack;
    } while (lVar13 < paVar11->objects);
  }
  if ((0 < iVar14) && (this->b->verbose != 0)) {
    printf("  Removed %d interior Steiner points.\n");
  }
  ptVar3 = this->b;
  ptVar3->fliplinklevel = iVar15;
  if (1 < ptVar3->supsteiner_level) {
    local_68.min_max_dihedangle = 0;
    local_68.initval = 0.0;
    local_68.imprval = 0.0;
    local_68.maxiter = 0;
    local_68.smthiter = 0;
    local_68.max_min_volume = 1;
    local_68.min_max_aspectratio = 0;
    iVar9 = 0;
    iVar14 = 0x1e;
    uVar18 = 0xd2f1a9fc;
    uVar19 = 0x3f50624d;
    iVar15 = 0x14;
    do {
      local_68.numofsearchdirs = iVar15;
      local_68.searchstep = (double)CONCAT44(uVar19,uVar18);
      local_68.maxiter = iVar14;
      uVar12 = 0;
      do {
        paVar11 = this->subvertstack;
        if (paVar11->objects < 1) {
          iVar15 = 0;
          bVar7 = false;
        }
        else {
          lVar13 = 0;
          iVar14 = 0;
          iVar15 = 0;
          do {
            searchpt = *(point *)(paVar11->toparray
                                  [(uint)lVar13 >> ((byte)paVar11->log2objectsperblock & 0x1f)] +
                                 (long)paVar11->objectbytes *
                                 (long)(int)(paVar11->objectsperblockmark & (uint)lVar13));
            if ((*(uint *)((long)searchpt + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) ==
                0x800) {
              this_00 = this;
              getvertexstar(this,1,searchpt,this->cavetetlist,(arraypool *)0x0,(arraypool *)0x0);
              paVar11 = this->cavetetlist;
              lVar4 = paVar11->objects;
              local_a8 = local_68.initval;
              if (0 < lVar4) {
                ppcVar5 = paVar11->toparray;
                iVar10 = paVar11->log2objectsperblock;
                uVar1 = paVar11->objectsperblockmark;
                iVar2 = paVar11->objectbytes;
                lVar16 = 0;
                do {
                  lVar6 = *(long *)(ppcVar5[(uint)lVar16 >> ((byte)iVar10 & 0x1f)] +
                                   (long)(int)((uint)lVar16 & uVar1) * (long)iVar2);
                  dVar8 = orient3dfast(this_00,*(double **)(lVar6 + 0x28),*(double **)(lVar6 + 0x20)
                                       ,*(double **)(lVar6 + 0x30),*(double **)(lVar6 + 0x38));
                  if ((lVar16 == 0) || (dVar8 < local_a8)) {
                    local_a8 = dVar8;
                  }
                  lVar16 = lVar16 + 1;
                } while (lVar4 != lVar16);
              }
              local_68.initval = local_a8;
              iVar10 = smoothpoint(this,searchpt,paVar11,1,&local_68);
              iVar15 = (iVar15 + 1) - (uint)(iVar10 == 0);
              iVar14 = (iVar14 + 1) - (uint)(0.0 < local_68.imprval);
              this->cavetetlist->objects = 0;
            }
            lVar13 = lVar13 + 1;
            paVar11 = this->subvertstack;
          } while (lVar13 < paVar11->objects);
          bVar7 = 0 < iVar14;
        }
        iVar9 = iVar9 + iVar15;
      } while ((iVar15 != 0) && (bVar17 = uVar12 < 2, uVar12 = uVar12 + 1, bVar17));
      iVar14 = -1;
      uVar18 = 0xeb1c432d;
      uVar19 = 0x3f1a36e2;
      iVar15 = 0x1e;
    } while ((bool)(bVar7 & 0 < local_68.maxiter));
    if (bVar7) {
      puts("BUG Report!  The mesh contain inverted elements.");
    }
    if ((this->b->verbose != 0) && (0 < iVar9)) {
      printf("  Smoothed %d Steiner points.\n");
    }
  }
  this->subvertstack->objects = 0;
  return 1;
}

Assistant:

int tetgenmesh::suppresssteinerpoints()
{

  if (!b->quiet) {
    printf("Suppressing Steiner points ...\n");
  }

  point rempt, *parypt;

  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = 100000; // Unlimited flip level.
  int suppcount = 0, remcount = 0;
  int i;

  // Try to suppress boundary Steiner points.
  for (i = 0; i < subvertstack->objects; i++) {
    parypt = (point *) fastlookup(subvertstack, i);
    rempt = *parypt;
    if (pointtype(rempt) != UNUSEDVERTEX) {
      if ((pointtype(rempt) == FREESEGVERTEX) || 
          (pointtype(rempt) == FREEFACETVERTEX)) {
        if (suppressbdrysteinerpoint(rempt)) {
          suppcount++;
        }
      }
    }
  } // i

  if (suppcount > 0) {
    if (b->verbose) {
      printf("  Suppressed %d boundary Steiner points.\n", suppcount);
    }
  }

  if (b->supsteiner_level > 0) { // -Y/1
    for (i = 0; i < subvertstack->objects; i++) {
      parypt = (point *) fastlookup(subvertstack, i);
      rempt = *parypt;
      if (pointtype(rempt) != UNUSEDVERTEX) {
        if (pointtype(rempt) == FREEVOLVERTEX) {
          if (removevertexbyflips(rempt)) {
            remcount++;
          }
        }
      }
    }
  }

  if (remcount > 0) {
    if (b->verbose) {
      printf("  Removed %d interior Steiner points.\n", remcount);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;

  if (b->supsteiner_level > 1) { // -Y/2
    // Smooth interior Steiner points.
    optparameters opm;
    triface *parytet;
    point *ppt;
    REAL ori;
    int smtcount, count, ivcount;
    int nt, j;

    // Point smooth options.
    opm.max_min_volume = 1;
    opm.numofsearchdirs = 20;
    opm.searchstep = 0.001;
    opm.maxiter = 30; // Limit the maximum iterations.

    smtcount = 0;

    do {

      nt = 0;

      while (1) {
        count = 0;
        ivcount = 0; // Clear the inverted count.

        for (i = 0; i < subvertstack->objects; i++) {
          parypt = (point *) fastlookup(subvertstack, i);
          rempt = *parypt;
          if (pointtype(rempt) == FREEVOLVERTEX) {
            getvertexstar(1, rempt, cavetetlist, NULL, NULL);
            // Calculate the initial smallest volume (maybe zero or negative).
            for (j = 0; j < cavetetlist->objects; j++) {
              parytet = (triface *) fastlookup(cavetetlist, j);
              ppt = (point *) &(parytet->tet[4]);
              ori = orient3dfast(ppt[1], ppt[0], ppt[2], ppt[3]);
              if (j == 0) {
                opm.initval = ori;
              } else {
                if (opm.initval > ori) opm.initval = ori; 
              }
            }
            if (smoothpoint(rempt, cavetetlist, 1, &opm)) {
              count++;
            }
            if (opm.imprval <= 0.0) {
              ivcount++; // The mesh contains inverted elements.
            }
            cavetetlist->restart();
          }
        } // i

        smtcount += count;

        if (count == 0) {
          // No point has been smoothed.
          break;
        }

        nt++;
        if (nt > 2) {
          break; // Already three iterations.
        }
      } // while

      if (ivcount > 0) {
        // There are inverted elements!
        if (opm.maxiter > 0) {
          // Set unlimited smoothing steps. Try again.
          opm.numofsearchdirs = 30;
          opm.searchstep = 0.0001;
          opm.maxiter = -1;
          continue;
        }
      }

      break;
    } while (1); // Additional loop for (ivcount > 0)

    if (ivcount > 0) {
      printf("BUG Report!  The mesh contain inverted elements.\n");
    }

    if (b->verbose) {
      if (smtcount > 0) {
        printf("  Smoothed %d Steiner points.\n", smtcount); 
      }
    }
  } // -Y2

  subvertstack->restart();

  return 1;
}